

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::MonitorTask::checkArguments
          (MonitorTask *this,ASTContext *context,Args *args,SourceRange range,Expression *iterOrThis
          )

{
  size_type sVar1;
  pointer ppEVar2;
  Expression *this_00;
  Type *this_01;
  Type *pTVar3;
  long lVar4;
  MonitorVisitor visitor;
  MonitorVisitor local_30;
  
  this_01 = DisplayTask::checkArguments(&this->super_DisplayTask,context,args,range,iterOrThis);
  pTVar3 = this_01->canonical;
  if (pTVar3 == (Type *)0x0) {
    Type::resolveCanonical(this_01);
    pTVar3 = this_01->canonical;
  }
  if ((pTVar3->super_Symbol).kind != ErrorType) {
    sVar1 = args->size_;
    if (sVar1 != 0) {
      ppEVar2 = args->data_;
      lVar4 = 0;
      local_30.context = context;
      do {
        this_00 = *(Expression **)((long)ppEVar2 + lVar4);
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                  (this_00,this_00,&local_30);
        lVar4 = lVar4 + 8;
      } while (sVar1 << 3 != lVar4);
    }
  }
  return this_01;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = DisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args)
            arg->visit(visitor);

        return result;
    }